

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::NeedRelinkBeforeInstall(cmGeneratorTarget *this,string *config)

{
  _Base_ptr p_Var1;
  cmMakefile *this_00;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  LinkClosure *pLVar7;
  string *psVar8;
  ostream *poVar9;
  cmake *this_01;
  string ll;
  string flagVar;
  undefined1 auStack_1f8 [16];
  cmLocalGenerator *local_1e8;
  cmGlobalGenerator *local_1e0;
  undefined1 local_1d8 [48];
  undefined1 local_1a8 [16];
  _Rb_tree_node_base local_198 [3];
  ios_base local_138 [264];
  
  TVar5 = cmTarget::GetType(this->Target);
  if ((((TVar5 != EXECUTABLE) && (TVar5 = cmTarget::GetType(this->Target), TVar5 != SHARED_LIBRARY))
      && (TVar5 = cmTarget::GetType(this->Target), TVar5 != MODULE_LIBRARY)) ||
     (bVar3 = cmTarget::GetHaveInstallRule(this->Target), !bVar3)) {
    return false;
  }
  this_00 = this->Makefile;
  p_Var1 = (_Base_ptr)(local_1a8 + 0x10);
  local_1a8._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_SKIP_RPATH","");
  bVar3 = cmMakefile::IsOn(this_00,(string *)local_1a8);
  if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
  }
  if (bVar3) {
    return false;
  }
  local_1a8._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BUILD_WITH_INSTALL_RPATH","")
  ;
  bVar3 = cmTarget::GetPropertyAsBool(this->Target,(string *)local_1a8);
  if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
  }
  if (bVar3) {
    return false;
  }
  bVar3 = IsChrpathUsed(this,config);
  if (bVar3) {
    return false;
  }
  pLVar7 = GetLinkClosure(this,config);
  pcVar2 = (pLVar7->LinkerLanguage)._M_dataplus._M_p;
  local_1e8 = (cmLocalGenerator *)local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + (pLVar7->LinkerLanguage)._M_string_length);
  if (local_1e0 != (cmGlobalGenerator *)0x0) {
    local_1a8._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CMAKE_SHARED_LIBRARY_RUNTIME_","");
    std::__cxx11::string::_M_append(local_1a8,(ulong)local_1e8);
    std::__cxx11::string::append(local_1a8);
    bVar3 = cmMakefile::IsSet(this->Makefile,(string *)local_1a8);
    if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
    }
    if (bVar3) {
      bVar3 = HaveBuildTreeRPATH(this,config);
      bVar4 = true;
      if (!bVar3) {
        bVar4 = HaveInstallTreeRPATH(this,config);
      }
      (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1a8);
      iVar6 = std::__cxx11::string::compare(local_1a8);
      if ((_Base_ptr)local_1a8._0_8_ != p_Var1) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0]._0_8_ + 1));
      }
      if (bVar4 == true && iVar6 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"The install of the ",0x13);
        psVar8 = cmTarget::GetName_abi_cxx11_(this->Target);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,
                   " target requires changing an RPATH from the build tree, but this is not supported with the Ninja generator unless on an ELF-based platform.  The CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this relinking step."
                   ,0xe1);
        this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
        std::__cxx11::stringbuf::str();
        GetBacktrace((cmGeneratorTarget *)auStack_1f8);
        cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1d8 + 0x10),
                            (cmListFileBacktrace *)auStack_1f8);
        if ((cmMakefile *)auStack_1f8._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_1f8._8_8_);
        }
        if ((undefined1 *)local_1d8._16_8_ != local_1d8 + 0x20) {
          operator_delete((void *)local_1d8._16_8_,local_1d8._32_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar4 = true;
      }
      goto LAB_002fa09f;
    }
  }
  bVar4 = false;
LAB_002fa09f:
  if (local_1e8 != (cmLocalGenerator *)local_1d8) {
    operator_delete(local_1e8,(ulong)(local_1d8._0_8_ + 1));
    return bVar4;
  }
  return bVar4;
}

Assistant:

bool cmGeneratorTarget::NeedRelinkBeforeInstall(
  const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if (this->GetType() != cmStateEnums::EXECUTABLE &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY) {
    return false;
  }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // If skipping all rpaths completely then no relinking is needed.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // If building with the install-tree rpath no relinking is needed.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // If chrpath is going to be used no relinking is needed.
  if (this->IsChrpathUsed(config)) {
    return false;
  }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string flagVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    flagVar += ll;
    flagVar += "_FLAG";
    if (!this->Makefile->IsSet(flagVar)) {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
    }
  } else {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
  }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  bool have_rpath =
    this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH(config);
  bool is_ninja =
    this->LocalGenerator->GetGlobalGenerator()->GetName() == "Ninja";

  if (have_rpath && is_ninja) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The install of the " << this->GetName() << " target requires "
      "changing an RPATH from the build tree, but this is not supported "
      "with the Ninja generator unless on an ELF-based platform.  The "
      "CMAKE_BUILD_WITH_INSTALL_RPATH variable may be set to avoid this "
      "relinking step."
      ;
    /* clang-format on */

    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return have_rpath;
}